

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

timediff_t Curl_conn_shutdown_timeleft(connectdata *conn,curltime *nowp)

{
  curltime cVar1;
  undefined4 uStack_44;
  int local_3c;
  time_t tStack_38;
  int i;
  curltime now;
  timediff_t ms;
  timediff_t left_ms;
  curltime *nowp_local;
  connectdata *conn_local;
  
  ms = 0;
  left_ms = (timediff_t)nowp;
  for (local_3c = 0; (conn->shutdown).timeout_ms != 0 && local_3c < 2; local_3c = local_3c + 1) {
    if ((conn->shutdown).start[local_3c].tv_sec != 0) {
      if (left_ms == 0) {
        cVar1 = Curl_now();
        tStack_38 = cVar1.tv_sec;
        now.tv_sec = CONCAT44(uStack_44,cVar1.tv_usec);
        left_ms = (timediff_t)&stack0xffffffffffffffc8;
      }
      now._8_8_ = Curl_shutdown_timeleft(conn,local_3c,(curltime *)left_ms);
      if ((now._8_8_ != 0) && ((ms == 0 || ((long)now._8_8_ < ms)))) {
        ms = now._8_8_;
      }
    }
  }
  return ms;
}

Assistant:

timediff_t Curl_conn_shutdown_timeleft(struct connectdata *conn,
                                       struct curltime *nowp)
{
  timediff_t left_ms = 0, ms;
  struct curltime now;
  int i;

  for(i = 0; conn->shutdown.timeout_ms && (i < 2); ++i) {
    if(!conn->shutdown.start[i].tv_sec)
      continue;
    if(!nowp) {
      now = Curl_now();
      nowp = &now;
    }
    ms = Curl_shutdown_timeleft(conn, i, nowp);
    if(ms && (!left_ms || ms < left_ms))
      left_ms = ms;
  }
  return left_ms;
}